

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeListGetString(xmlDocPtr doc,xmlNode *list,int inLine)

{
  int local_28;
  int escMode;
  int inLine_local;
  xmlNode *list_local;
  xmlDocPtr doc_local;
  
  if (list == (xmlNode *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if (inLine == 0) {
      if ((list->parent == (_xmlNode *)0x0) || (list->parent->type != XML_ATTRIBUTE_NODE)) {
        local_28 = 1;
      }
      else {
        local_28 = 2;
      }
    }
    else {
      local_28 = 0;
    }
    doc_local = (xmlDocPtr)xmlNodeListGetStringInternal(doc,list,local_28);
  }
  return (xmlChar *)doc_local;
}

Assistant:

xmlChar *
xmlNodeListGetString(xmlDocPtr doc, const xmlNode *list, int inLine)
{
    int escMode;

    /* backward compatibility */
    if (list == NULL)
        return(NULL);

    if (inLine) {
        escMode = 0;
    } else {
        if ((list->parent != NULL) &&
            (list->parent->type == XML_ATTRIBUTE_NODE))
            escMode = 2;
        else
            escMode = 1;
    }

    return(xmlNodeListGetStringInternal(doc, list, escMode));
}